

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O1

bool absl::str_format_internal::anon_unknown_0::FallbackToSnprintf<double>
               (double v,FormatConversionSpecImpl *conv,FormatSinkImpl *sink)

{
  size_type sVar1;
  undefined1 uVar2;
  uint uVar3;
  Flags in_DL;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  _Alloc_hider _Var8;
  string_view v_00;
  string space;
  char fmt [32];
  string local_88;
  FormatSinkImpl *local_68;
  double local_60;
  char local_58;
  undefined2 local_57;
  undefined1 auStack_55 [37];
  
  uVar5 = 0;
  if (0 < conv->width_) {
    uVar5 = conv->width_;
  }
  uVar7 = 0xffffffff;
  if (-1 < conv->precision_) {
    uVar7 = conv->precision_;
  }
  local_58 = '%';
  local_68 = sink;
  local_60 = v;
  FlagsToString_abi_cxx11_(&local_88,(str_format_internal *)(ulong)conv->flags_,in_DL);
  sVar1 = local_88._M_string_length;
  memcpy(&local_57,local_88._M_dataplus._M_p,local_88._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  auStack_55[sVar1] = 0x2a;
  *(undefined2 *)((long)&local_57 + sVar1) = 0x2e2a;
  if ((ulong)conv->conv_ < 0x13) {
    uVar2 = (&DAT_00178b40)[conv->conv_];
  }
  else {
    uVar2 = 0;
  }
  auStack_55[sVar1 + 1] = uVar2;
  auStack_55[sVar1 + 2] = 0;
  if (0x1a < (long)sVar1) {
    __assert_fail("fp < fmt + sizeof(fmt)",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                  ,0x3d1,
                  "bool absl::str_format_internal::(anonymous namespace)::FallbackToSnprintf(const Float, const FormatConversionSpecImpl &, FormatSinkImpl *) [Float = double]"
                 );
  }
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  _Var8._M_p = (pointer)0x0;
  std::__cxx11::string::_M_construct((ulong)&local_88,'\0');
  uVar4 = 0;
  do {
    uVar3 = snprintf(local_88._M_dataplus._M_p,local_88._M_string_length,&local_58,local_60,
                     (ulong)uVar5,(ulong)uVar7);
    if ((int)uVar3 < 0) {
      iVar6 = 1;
    }
    else if (uVar3 < local_88._M_string_length) {
      iVar6 = 3;
      uVar4 = (ulong)uVar3;
      _Var8._M_p = local_88._M_dataplus._M_p;
    }
    else {
      iVar6 = 0;
      std::__cxx11::string::resize((ulong)&local_88,(char)uVar3 + '\x01');
    }
  } while (iVar6 == 0);
  if (iVar6 == 3) {
    v_00._M_str = _Var8._M_p;
    v_00._M_len = uVar4;
    FormatSinkImpl::Append(local_68,v_00);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return iVar6 == 3;
}

Assistant:

bool FallbackToSnprintf(const Float v, const FormatConversionSpecImpl &conv,
                        FormatSinkImpl *sink) {
  int w = conv.width() >= 0 ? conv.width() : 0;
  int p = conv.precision() >= 0 ? conv.precision() : -1;
  char fmt[32];
  {
    char *fp = fmt;
    *fp++ = '%';
    fp = CopyStringTo(FormatConversionSpecImplFriend::FlagsToString(conv), fp);
    fp = CopyStringTo("*.*", fp);
    if (std::is_same<long double, Float>()) {
      *fp++ = 'L';
    }
    *fp++ = FormatConversionCharToChar(conv.conversion_char());
    *fp = 0;
    assert(fp < fmt + sizeof(fmt));
  }
  std::string space(512, '\0');
  absl::string_view result;
  while (true) {
    int n = snprintf(&space[0], space.size(), fmt, w, p, v);
    if (n < 0) return false;
    if (static_cast<size_t>(n) < space.size()) {
      result = absl::string_view(space.data(), static_cast<size_t>(n));
      break;
    }
    space.resize(static_cast<size_t>(n) + 1);
  }
  sink->Append(result);
  return true;
}